

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryUtils.hpp
# Opt level: O0

void OpenMD::Utils::
     deletePointers<std::vector<OpenMD::ConstraintPair*,std::allocator<OpenMD::ConstraintPair*>>>
               (vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
                *container)

{
  bool bVar1;
  iterator val;
  ConstraintPair **elem;
  iterator __end0;
  iterator __begin0;
  vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *__range3;
  vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>
  *in_stack_ffffffffffffffd8;
  __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
  local_18 [3];
  
  local_18[0]._M_current =
       (ConstraintPair **)
       std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::begin
                 (in_stack_ffffffffffffffd8);
  val = std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>::end
                  (in_stack_ffffffffffffffd8);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
                        *)val._M_current,
                       (__normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
                        *)in_stack_ffffffffffffffd8);
    if (!bVar1) break;
    in_stack_ffffffffffffffd8 =
         (vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_> *)
         __gnu_cxx::
         __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
         ::operator*(local_18);
    details::lifted_deleter<OpenMD::ConstraintPair*>((ConstraintPair *)val._M_current);
    __gnu_cxx::
    __normal_iterator<OpenMD::ConstraintPair_**,_std::vector<OpenMD::ConstraintPair_*,_std::allocator<OpenMD::ConstraintPair_*>_>_>
    ::operator++(local_18);
  }
  return;
}

Assistant:

void deletePointers(Container& container) {
    if constexpr(details::is_container_v<typename Container::value_type>) {
      for (auto& elem : container)
        deletePointers(elem);
    } else {
      for (auto& elem : container)
        details::lifted_deleter(elem);
    }
  }